

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::removeUnits(Model *this,UnitsPtr *units)

{
  bool bVar1;
  ModelImpl *pMVar2;
  element_type *this_00;
  UnitsImpl *this_01;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_28;
  const_iterator result;
  bool status;
  UnitsPtr *units_local;
  Model *this_local;
  
  result._M_current._7_1_ = 0;
  pMVar2 = pFunc(this);
  local_28._M_current = (shared_ptr<libcellml::Units> *)ModelImpl::findUnits(pMVar2,units);
  pMVar2 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::Units> *)
       std::
       vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ::end(&pMVar2->mUnits);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)units);
    this_01 = Units::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_01);
    pMVar2 = pFunc(this);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    erase(&pMVar2->mUnits,(const_iterator)local_28._M_current);
    result._M_current._7_1_ = 1;
  }
  return (bool)(result._M_current._7_1_ & 1);
}

Assistant:

bool Model::removeUnits(const UnitsPtr &units)
{
    bool status = false;
    auto result = pFunc()->findUnits(units);
    if (result != pFunc()->mUnits.end()) {
        units->pFunc()->removeParent();
        pFunc()->mUnits.erase(result);
        status = true;
    }

    return status;
}